

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

void __thiscall
duckdb::Serializer::WriteValue<duckdb::ColumnInfo>
          (Serializer *this,vector<duckdb::ColumnInfo,_true> *vec)

{
  pointer pCVar1;
  ColumnInfo *item;
  pointer value;
  
  (*this->_vptr_Serializer[8])
            (this,((long)(vec->super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>
                         ).
                         super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(vec->super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>
                         ).
                         super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  pCVar1 = (vec->super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>).
           super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (value = (vec->super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>).
               super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
               super__Vector_impl_data._M_start; value != pCVar1; value = value + 1) {
    WriteValue<duckdb::ColumnInfo>(this,value);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}